

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_op.hpp
# Opt level: O0

void __thiscall
asio::detail::
resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:380:13)>
::resolve_op(resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
             *this,weak_cancel_token_type *cancel_token,query_type *query,io_context_impl *ioc,
            anon_class_8_1_8991fb9c *handler)

{
  func_type in_RCX;
  error_code *in_RSI;
  scheduler_operation *in_RDI;
  undefined8 *in_R8;
  weak_ptr<void> *in_stack_ffffffffffffffa8;
  basic_resolver_query<asio::ip::tcp> *in_stack_ffffffffffffffc8;
  basic_resolver_query<asio::ip::tcp> *in_stack_ffffffffffffffd0;
  
  scheduler_operation::scheduler_operation(in_RDI,do_complete);
  std::weak_ptr<void>::weak_ptr((weak_ptr<void> *)in_RSI,in_stack_ffffffffffffffa8);
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  in_RDI[6].func_ = in_RCX;
  *(undefined8 *)&in_RDI[6].task_result_ = *in_R8;
  std::error_code::error_code(in_RSI);
  *(undefined8 *)&in_RDI[7].task_result_ = 0;
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:380:13),_asio::system_executor>
  ::start((anon_class_8_1_8991fb9c *)&in_RDI[6].task_result_);
  return;
}

Assistant:

resolve_op(socket_ops::weak_cancel_token_type cancel_token,
      const query_type& query, io_context_impl& ioc, Handler& handler)
    : operation(&resolve_op::do_complete),
      cancel_token_(cancel_token),
      query_(query),
      io_context_impl_(ioc),
      handler_(ASIO_MOVE_CAST(Handler)(handler)),
      addrinfo_(0)
  {
    handler_work<Handler>::start(handler_);
  }